

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

int __thiscall llvm::yaml::Scanner::init(Scanner *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  MemoryBufferRef Ref;
  uint uVar2;
  char *in_stack_00000008;
  size_t in_stack_00000010;
  char *in_stack_00000018;
  size_t in_stack_00000020;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> local_28;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> local_20;
  
  (this->InputBuffer).Buffer.Data = in_stack_00000008;
  (this->InputBuffer).Buffer.Length = in_stack_00000010;
  (this->InputBuffer).Identifier.Data = in_stack_00000018;
  (this->InputBuffer).Identifier.Length = in_stack_00000020;
  pcVar1 = (this->InputBuffer).Buffer.Data;
  this->Current = pcVar1;
  this->End = pcVar1 + (this->InputBuffer).Buffer.Length;
  this->Indent = -1;
  this->Column = 0;
  this->Line = 0;
  this->FlowLevel = 0;
  this->IsStartOfStream = true;
  this->IsSimpleKeyAllowed = true;
  this->Failed = false;
  Ref.Buffer.Length = in_stack_00000010;
  Ref.Buffer.Data = in_stack_00000008;
  Ref.Identifier.Data = in_stack_00000018;
  Ref.Identifier.Length = in_stack_00000020;
  MemoryBuffer::getMemBuffer(Ref,SUB81(&local_28,0));
  local_20._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (MemoryBuffer *)0x0;
  uVar2 = SourceMgr::AddNewSourceBuffer
                    (this->SM,(unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                               *)&local_20,(SMLoc)0x0);
  if (local_20._M_head_impl != (MemoryBuffer *)0x0) {
    uVar2 = (*(local_20._M_head_impl)->_vptr_MemoryBuffer[1])();
  }
  local_20._M_head_impl = (MemoryBuffer *)0x0;
  if (local_28._M_head_impl != (MemoryBuffer *)0x0) {
    uVar2 = (*(local_28._M_head_impl)->_vptr_MemoryBuffer[1])();
  }
  return uVar2;
}

Assistant:

void Scanner::init(MemoryBufferRef Buffer) {
  InputBuffer = Buffer;
  Current = InputBuffer.getBufferStart();
  End = InputBuffer.getBufferEnd();
  Indent = -1;
  Column = 0;
  Line = 0;
  FlowLevel = 0;
  IsStartOfStream = true;
  IsSimpleKeyAllowed = true;
  Failed = false;
  std::unique_ptr<MemoryBuffer> InputBufferOwner =
      MemoryBuffer::getMemBuffer(Buffer);
  SM.AddNewSourceBuffer(std::move(InputBufferOwner), SMLoc());
}